

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_long_const&>::
captureExpression<(Catch::Internal::Operator)0,unsigned_long>
          (ExpressionLhs<unsigned_long_const&> *this,unsigned_long *rhs)

{
  bool result;
  ResultBuilder *pRVar1;
  char *__s;
  unsigned_long value;
  unsigned_long value_00;
  allocator<char> local_89;
  string local_88;
  string local_68;
  string local_38;
  unsigned_long *local_18;
  unsigned_long *rhs_local;
  ExpressionLhs<const_unsigned_long_&> *this_local;
  
  pRVar1 = *(ResultBuilder **)this;
  local_18 = rhs;
  rhs_local = (unsigned_long *)this;
  result = Internal::compare<(Catch::Internal::Operator)0,unsigned_long,unsigned_long>
                     (*(unsigned_long **)(this + 8),rhs);
  pRVar1 = ResultBuilder::setResultType(pRVar1,result);
  Catch::toString_abi_cxx11_(&local_38,(Catch *)**(undefined8 **)(this + 8),value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Catch::toString_abi_cxx11_(&local_68,(Catch *)*local_18,value_00);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_68);
  __s = Internal::OperatorTraits<(Catch::Internal::Operator)0>::getName();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }